

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaRoberts_dns.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  N_Vector y;
  void *returnvalue;
  FILE *__stream;
  FILE *FID;
  SUNContext ctx;
  SUNNonlinearSolver NLS;
  SUNLinearSolver LS;
  SUNMatrix A;
  int rootsfound [2];
  int retvalr;
  int retval;
  int iout;
  sunrealtype tret;
  sunrealtype tout;
  sunrealtype tout1;
  sunrealtype t0;
  sunrealtype *atval;
  sunrealtype *ypval;
  sunrealtype *yval;
  sunrealtype rtol;
  N_Vector avtol;
  N_Vector yp;
  N_Vector yy;
  void *mem;
  undefined8 in_stack_ffffffffffffff58;
  N_Vector in_stack_ffffffffffffff60;
  N_Vector avtol_00;
  sunrealtype sVar3;
  void *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_6c;
  undefined1 local_68 [8];
  double local_60;
  double local_58;
  undefined8 local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0;
  local_28 = 0;
  local_20 = 0;
  local_18 = 0;
  local_48 = (undefined8 *)0x0;
  local_40 = (undefined8 *)0x0;
  local_38 = (undefined8 *)0x0;
  sVar3 = 0.0;
  avtol_00 = (N_Vector)0x0;
  SUNContext_Create(0,&stack0xffffffffffffff60);
  iVar1 = check_retval(avtol_00,(char *)in_stack_ffffffffffffff60,
                       (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  if (iVar1 == 0) {
    local_18 = N_VNew_Serial(3,in_stack_ffffffffffffff60);
    iVar1 = check_retval(avtol_00,(char *)in_stack_ffffffffffffff60,
                         (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    if (iVar1 == 0) {
      local_20 = N_VClone(local_18);
      iVar1 = check_retval(avtol_00,(char *)in_stack_ffffffffffffff60,
                           (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      if (iVar1 == 0) {
        local_28 = N_VClone(local_18);
        iVar1 = check_retval(avtol_00,(char *)in_stack_ffffffffffffff60,
                             (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        if (iVar1 == 0) {
          local_38 = (undefined8 *)N_VGetArrayPointer(local_18);
          *local_38 = 0x3ff0000000000000;
          local_38[1] = 0;
          local_38[2] = 0;
          local_40 = (undefined8 *)N_VGetArrayPointer(local_20);
          *local_40 = 0xbfa47ae147ae147b;
          local_40[1] = 0x3fa47ae147ae147b;
          local_40[2] = 0;
          local_30 = 0x3f1a36e2eb1c432d;
          local_48 = (undefined8 *)N_VGetArrayPointer(local_28);
          *local_48 = 0x3e45798ee2308c3a;
          local_48[1] = 0x3eb0c6f7a0b5ed8d;
          local_48[2] = 0x3eb0c6f7a0b5ed8d;
          local_50 = 0;
          local_58 = 0.4;
          PrintHeader(sVar3,avtol_00,in_stack_ffffffffffffff60);
          local_10 = IDACreate(in_stack_ffffffffffffff60);
          iVar1 = check_retval(avtol_00,(char *)in_stack_ffffffffffffff60,
                               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          if (iVar1 == 0) {
            IDAInit(local_50,local_10,resrob,local_18,local_20);
            iVar1 = check_retval(avtol_00,(char *)in_stack_ffffffffffffff60,
                                 (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
            if (iVar1 == 0) {
              IDASVtolerances(local_30,local_10,local_28);
              iVar1 = check_retval(avtol_00,(char *)in_stack_ffffffffffffff60,
                                   (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
              if (iVar1 == 0) {
                IDARootInit(local_10,2,grob);
                iVar1 = check_retval(avtol_00,(char *)in_stack_ffffffffffffff60,
                                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
                if (iVar1 == 0) {
                  sVar3 = (sunrealtype)SUNDenseMatrix(3,3,in_stack_ffffffffffffff60);
                  iVar1 = check_retval(avtol_00,(char *)in_stack_ffffffffffffff60,
                                       (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
                  if (iVar1 == 0) {
                    y = (N_Vector)SUNLinSol_Dense(local_18,sVar3,in_stack_ffffffffffffff60);
                    iVar1 = check_retval(avtol_00,(char *)in_stack_ffffffffffffff60,
                                         (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
                    if (iVar1 == 0) {
                      IDASetLinearSolver(local_10,y,sVar3);
                      iVar1 = check_retval(avtol_00,(char *)in_stack_ffffffffffffff60,
                                           (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
                      if (iVar1 == 0) {
                        IDASetJacFn(local_10,jacrob);
                        iVar1 = check_retval(avtol_00,(char *)in_stack_ffffffffffffff60,
                                             (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
                        if (iVar1 == 0) {
                          returnvalue = (void *)SUNNonlinSol_Newton(local_18,
                                                  in_stack_ffffffffffffff60);
                          iVar1 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff60,
                                               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
                          if (iVar1 == 0) {
                            IDASetNonlinearSolver(local_10,returnvalue);
                            iVar1 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff60,
                                                 (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
                            if (iVar1 == 0) {
                              local_6c = 0;
                              local_60 = local_58;
                              do {
                                iVar1 = IDASolve(local_60,local_10,local_68,local_18,local_20,1);
                                PrintOutput(in_stack_ffffffffffffff80,sVar3,y);
                                iVar2 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff60,
                                                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20)
                                                    );
                                if (iVar2 != 0) {
                                  return 1;
                                }
                                if (iVar1 == 2) {
                                  in_stack_ffffffffffffff8c =
                                       IDAGetRootInfo(local_10,&stack0xffffffffffffff84);
                                  check_retval(returnvalue,(char *)in_stack_ffffffffffffff60,
                                               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
                                  PrintRootInfo(0,0x10295b);
                                }
                                if (iVar1 == 0) {
                                  local_6c = local_6c + 1;
                                  local_60 = local_60 * 10.0;
                                }
                              } while (local_6c != 0xc);
                              printf("\nFinal Statistics:\n");
                              IDAPrintAllStats(local_10,_stdout,0);
                              __stream = fopen("idaRoberts_dns_stats.csv","w");
                              IDAPrintAllStats(local_10,__stream,1);
                              fclose(__stream);
                              iVar1 = check_ans((N_Vector)
                                                CONCAT44(in_stack_ffffffffffffff8c,
                                                         in_stack_ffffffffffffff88),
                                                (sunrealtype)in_stack_ffffffffffffff80,sVar3,y);
                              IDAFree(&local_10);
                              SUNNonlinSolFree(returnvalue);
                              SUNLinSolFree(y);
                              SUNMatDestroy(sVar3);
                              N_VDestroy(local_28);
                              N_VDestroy(local_18);
                              N_VDestroy(local_20);
                              SUNContext_Free(&stack0xffffffffffffff60);
                              local_4 = iVar1;
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  void* mem;
  N_Vector yy, yp, avtol;
  sunrealtype rtol, *yval, *ypval, *atval;
  sunrealtype t0, tout1, tout, tret;
  int iout, retval, retvalr;
  int rootsfound[2];
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNNonlinearSolver NLS;
  SUNContext ctx;
  FILE* FID;

  mem = NULL;
  yy = yp = avtol = NULL;
  yval = ypval = atval = NULL;
  A                    = NULL;
  LS                   = NULL;
  NLS                  = NULL;

  /* Create SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate N-vectors. */
  yy = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (1); }
  yp = N_VClone(yy);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }
  avtol = N_VClone(yy);
  if (check_retval((void*)avtol, "N_VNew_Serial", 0)) { return (1); }

  /* Create and initialize  y, y', and absolute tolerance vectors. */
  yval    = N_VGetArrayPointer(yy);
  yval[0] = ONE;
  yval[1] = ZERO;
  yval[2] = ZERO;

  ypval    = N_VGetArrayPointer(yp);
  ypval[0] = SUN_RCONST(-0.04);
  ypval[1] = SUN_RCONST(0.04);
  ypval[2] = ZERO;

  rtol = SUN_RCONST(1.0e-4);

  atval    = N_VGetArrayPointer(avtol);
  atval[0] = SUN_RCONST(1.0e-8);
  atval[1] = SUN_RCONST(1.0e-6);
  atval[2] = SUN_RCONST(1.0e-6);

  /* Integration limits */
  t0    = ZERO;
  tout1 = SUN_RCONST(0.4);

  PrintHeader(rtol, avtol, yy);

  /* Call IDACreate and IDAInit to initialize IDA memory */
  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }
  retval = IDAInit(mem, resrob, t0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }
  /* Call IDASVtolerances to set tolerances */
  retval = IDASVtolerances(mem, rtol, avtol);
  if (check_retval(&retval, "IDASVtolerances", 1)) { return (1); }

  /* Call IDARootInit to specify the root function grob with 2 components */
  retval = IDARootInit(mem, 2, grob);
  if (check_retval(&retval, "IDARootInit", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine */
  retval = IDASetJacFn(mem, jacrob);
  if (check_retval(&retval, "IDASetJacFn", 1)) { return (1); }

  /* Create Newton SUNNonlinearSolver object. IDA uses a
   * Newton SUNNonlinearSolver by default, so it is unnecessary
   * to create it and attach it. It is done in this example code
   * solely for demonstration purposes. */
  NLS = SUNNonlinSol_Newton(yy, ctx);
  if (check_retval((void*)NLS, "SUNNonlinSol_Newton", 0)) { return (1); }

  /* Attach the nonlinear solver */
  retval = IDASetNonlinearSolver(mem, NLS);
  if (check_retval(&retval, "IDASetNonlinearSolver", 1)) { return (1); }

  /* In loop, call IDASolve, print results, and test for error.
     Break out of loop when NOUT preset output times have been reached. */

  iout = 0;
  tout = tout1;
  while (1)
  {
    retval = IDASolve(mem, tout, &tret, yy, yp, IDA_NORMAL);

    PrintOutput(mem, tret, yy);

    if (check_retval(&retval, "IDASolve", 1)) { return (1); }

    if (retval == IDA_ROOT_RETURN)
    {
      retvalr = IDAGetRootInfo(mem, rootsfound);
      check_retval(&retvalr, "IDAGetRootInfo", 1);
      PrintRootInfo(rootsfound[0], rootsfound[1]);
    }

    if (retval == IDA_SUCCESS)
    {
      iout++;
      tout *= SUN_RCONST(10.0);
    }

    if (iout == NOUT) { break; }
  }

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("idaRoberts_dns_stats.csv", "w");
  retval = IDAPrintAllStats(mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* check the solution error */
  retval = check_ans(yy, tret, rtol, avtol);

  /* Free memory */
  IDAFree(&mem);
  SUNNonlinSolFree(NLS);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(avtol);
  N_VDestroy(yy);
  N_VDestroy(yp);
  SUNContext_Free(&ctx);

  return (retval);
}